

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

void wait_for_pending_write(CMConnection conn)

{
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  long lVar4;
  long *in_RDI;
  bool bVar5;
  timespec ts_3;
  timespec ts_2;
  int cond;
  timespec ts_1;
  timespec ts;
  CMControlList cl;
  CMControlList in_stack_ffffffffffffff60;
  CMConnection in_stack_ffffffffffffff68;
  CManager in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff80;
  FILE *pFVar6;
  CManager in_stack_ffffffffffffff88;
  FILE *in_stack_ffffffffffffff98;
  CMTraceType trace_type;
  CManager in_stack_ffffffffffffffa0;
  timespec local_58;
  timespec local_48;
  int local_34;
  timespec local_30;
  timespec local_20;
  long local_10;
  long *local_8;
  
  local_10 = *(long *)(*in_RDI + 0x20);
  local_8 = in_RDI;
  iVar1 = CManager_locked((CManager)*in_RDI);
  if (iVar1 == 0) {
    __assert_fail("CManager_locked(conn->cm)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                  ,0xc2a,"void wait_for_pending_write(CMConnection)");
  }
  iVar1 = CMtrace_val[3];
  if (*(long *)(*local_8 + 0x120) == 0) {
    iVar1 = CMtrace_init(in_stack_ffffffffffffffa0,
                         (CMTraceType)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      in_stack_ffffffffffffff98 = *(FILE **)(*local_8 + 0x120);
      _Var2 = getpid();
      in_stack_ffffffffffffffa0 = (CManager)(long)_Var2;
      pVar3 = pthread_self();
      fprintf(in_stack_ffffffffffffff98,"P%lxT%lx - ",in_stack_ffffffffffffffa0,pVar3);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_20);
      fprintf(*(FILE **)(*local_8 + 0x120),"%lld.%.9ld - ",local_20.tv_sec,local_20.tv_nsec);
    }
    fprintf(*(FILE **)(*local_8 + 0x120),"Wait for pending write for conn %p\n",local_8);
  }
  fflush(*(FILE **)(*local_8 + 0x120));
  if ((*(int *)(local_10 + 0xe8) == 0) ||
     (pVar3 = pthread_self(), pVar3 == *(pthread_t *)(local_10 + 0xf0))) {
    while( true ) {
      trace_type = (CMTraceType)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      bVar5 = false;
      if ((int)local_8[0x24] != 0) {
        bVar5 = (int)local_8[5] == 0;
      }
      if (!bVar5) break;
      iVar1 = CMtrace_val[3];
      if (*(long *)(*local_8 + 0x120) == 0) {
        iVar1 = CMtrace_init(in_stack_ffffffffffffffa0,trace_type);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          pFVar6 = *(FILE **)(*local_8 + 0x120);
          _Var2 = getpid();
          lVar4 = (long)_Var2;
          pVar3 = pthread_self();
          fprintf(pFVar6,"P%lxT%lx - ",lVar4,pVar3);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_30);
          fprintf(*(FILE **)(*local_8 + 0x120),"%lld.%.9ld - ",local_30.tv_sec,local_30.tv_nsec);
        }
        fprintf(*(FILE **)(*local_8 + 0x120),"Control list wait for conn %p\n",local_8);
      }
      fflush(*(FILE **)(*local_8 + 0x120));
      CMcontrol_list_wait(in_stack_ffffffffffffff60);
    }
  }
  else {
    while( true ) {
      trace_type = (CMTraceType)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      bVar5 = false;
      if ((int)local_8[0x24] != 0) {
        bVar5 = (int)local_8[5] == 0;
      }
      if (!bVar5) break;
      local_34 = INT_CMCondition_get(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      add_pending_write_callback
                ((CMConnection)in_stack_ffffffffffffff70,
                 (CMWriteCallbackFunc)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      iVar1 = CMtrace_val[3];
      if (*(long *)(*local_8 + 0x120) == 0) {
        iVar1 = CMtrace_init(in_stack_ffffffffffffffa0,
                             (CMTraceType)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          in_stack_ffffffffffffff68 = *(CMConnection *)(*local_8 + 0x120);
          _Var2 = getpid();
          in_stack_ffffffffffffff70 = (CManager)(long)_Var2;
          pVar3 = pthread_self();
          fprintf((FILE *)in_stack_ffffffffffffff68,"P%lxT%lx - ",in_stack_ffffffffffffff70,pVar3);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_48);
          fprintf(*(FILE **)(*local_8 + 0x120),"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
        }
        fprintf(*(FILE **)(*local_8 + 0x120),"Condition wait for conn %p\n",local_8);
      }
      fflush(*(FILE **)(*local_8 + 0x120));
      iVar1 = INT_CMCondition_wait
                        (in_stack_ffffffffffffff88,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
      if (iVar1 == 0) {
        *(undefined4 *)(local_8 + 0x24) = 0;
      }
    }
  }
  iVar1 = CMtrace_val[3];
  if (*(long *)(*local_8 + 0x120) == 0) {
    iVar1 = CMtrace_init(in_stack_ffffffffffffffa0,trace_type);
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      pFVar6 = *(FILE **)(*local_8 + 0x120);
      _Var2 = getpid();
      lVar4 = (long)_Var2;
      pVar3 = pthread_self();
      fprintf(pFVar6,"P%lxT%lx - ",lVar4,pVar3);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_58);
      fprintf(*(FILE **)(*local_8 + 0x120),"%lld.%.9ld - ",local_58.tv_sec,local_58.tv_nsec);
    }
    fprintf(*(FILE **)(*local_8 + 0x120),"Done waiting for pending write for conn %p\n",local_8);
  }
  fflush(*(FILE **)(*local_8 + 0x120));
  return;
}

Assistant:

void
 wait_for_pending_write(CMConnection conn)
 {
     CMControlList cl = conn->cm->control_list;
     assert(CManager_locked(conn->cm));
     CMtrace_out(conn->cm, CMLowLevelVerbose, "Wait for pending write for conn %p\n", conn);

     if ((!cl->has_thread) || (thr_thread_self() == cl->server_thread)) {
	 /* single thread working, just poll network */
	 while(conn->write_pending && !conn->closed) {
	     CMtrace_out(conn->cm, CMLowLevelVerbose, "Control list wait for conn %p\n", conn);
	     CMcontrol_list_wait(cl);
	 }
     } else {
	 /* other thread is handling the network wait for it to wake us up */
	 while (conn->write_pending && !conn->closed) {
	     int cond = INT_CMCondition_get(conn->cm, conn);
	     add_pending_write_callback(conn, wake_pending_write, 
					(void*) (intptr_t)cond);
	     CMtrace_out(conn->cm, CMLowLevelVerbose, "Condition wait for conn %p\n", conn);
	     if (INT_CMCondition_wait(conn->cm, cond) == 0) {
		 /* condition wait failed, connection is dead */
		 conn->write_pending = 0;
	     }
	 }
     }	    
     CMtrace_out(conn->cm, CMLowLevelVerbose, "Done waiting for pending write for conn %p\n", conn);
 }